

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_group.hpp
# Opt level: O2

void __thiscall
oqpi::
sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeImpl(sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  bool bVar1;
  task_handle hTask;
  
  popTask((sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)&stack0xffffffffffffffe8);
  bVar1 = task_handle::tryGrab((task_handle *)&stack0xffffffffffffffe8);
  if (bVar1) {
    task_handle::execute((task_handle *)&stack0xffffffffffffffe8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

virtual void executeImpl() override final
        {
            auto hTask = popTask();
            if (hTask.tryGrab())
            {
                hTask.execute();
            }
        }